

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::init(BlendFuncCase *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int iVar1;
  allocator<char> local_31;
  string local_30;
  
  context = (this->super_TestCase).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_EXT_draw_buffers_indexed",&local_31);
  isExtensionSupported(context,&local_30);
  iVar1 = std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

void BlendFuncCase::init (void)
{
	isExtensionSupported(m_context, "GL_EXT_draw_buffers_indexed");
}